

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O1

void dmrC_warning(dmr_C *C,position pos,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined1 local_28 [8];
  va_list args;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (C->Wsparse_error == 0) {
    if ((C->max_warnings == 0) || (C->has_error != 0)) {
      C->show_info = 0;
    }
    else {
      iVar1 = C->max_warnings + -1;
      C->max_warnings = iVar1;
      if (iVar1 == 0) {
        C->show_info = 0;
        fmt = "too many warnings";
      }
      args[0].overflow_arg_area = local_d8;
      args[0]._0_8_ = &stack0x00000008;
      local_28._0_4_ = 0x18;
      local_28._4_4_ = 0x30;
      do_warn(C,"warning: ",pos,fmt,(__va_list_tag *)local_28);
    }
  }
  else {
    args[0].overflow_arg_area = local_d8;
    args[0]._0_8_ = &stack0x00000008;
    local_28._0_4_ = 0x18;
    local_28._4_4_ = 0x30;
    do_error(C,pos,fmt,(__va_list_tag *)local_28);
  }
  return;
}

Assistant:

void dmrC_warning(struct dmr_C *C, struct position pos, const char *fmt, ...)
{
	va_list args;

	if (C->Wsparse_error) {
		va_start(args, fmt);
		do_error(C, pos, fmt, args);
		va_end(args);
		return;
	}
	if (!C->max_warnings || C->has_error) {
		C->show_info = 0;
		return;
	}

	if (!--C->max_warnings) {
		C->show_info = 0;
		fmt = "too many warnings";
	}

	va_start(args, fmt);
	do_warn(C, "warning: ", pos, fmt, args);
	va_end(args);
}